

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
ChainstateManager::ReportHeadersPresync
          (ChainstateManager *this,arith_uint256 *work,int64_t height,int64_t timestamp)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  strong_ordering sVar3;
  SynchronizationState SVar4;
  undefined8 uVar5;
  Notifications *pNVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ConstevalFormatString<2U> in_RSI;
  size_t in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000020;
  long *in_stack_00000030;
  double *in_stack_00000038;
  bool initial_download;
  double progress;
  int64_t blocks_left;
  time_point now;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  undefined2 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7a;
  undefined1 in_stack_fffffffffffffe7b;
  int in_stack_fffffffffffffe7c;
  Params *in_stack_fffffffffffffe80;
  base_uint<256U> *in_stack_fffffffffffffe88;
  uint256 *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  char *flag;
  int source_line;
  ChainstateManager *in_stack_ffffffffffffff20;
  size_t sVar7;
  char *in_stack_ffffffffffffff38;
  string_view in_stack_ffffffffffffff40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flag = "cs_main";
  source_line = 0;
  sVar7 = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe7c,(RecursiveMutex *)0x7e37b7);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe7c,
                      CONCAT13(in_stack_fffffffffffffe7b,
                               CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78))));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),in_stack_fffffffffffffeb0
             ,(char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
             SUB41((uint)in_stack_fffffffffffffe98 >> 0x18,0));
  GetConsensus((ChainstateManager *)
               CONCAT44(in_stack_fffffffffffffe7c,
                        CONCAT13(in_stack_fffffffffffffe7b,
                                 CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78))));
  UintToArith256(in_stack_fffffffffffffe90);
  bVar2 = operator>=(in_stack_fffffffffffffe88,(base_uint<256U> *)in_stack_fffffffffffffe80);
  if (bVar2) {
    bVar2 = true;
  }
  else {
    uVar5 = std::chrono::_V2::steady_clock::now();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,
                        CONCAT13(in_stack_fffffffffffffe7b,
                                 CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78))),
               (int *)0x7e38c6);
    std::chrono::operator+
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffe80,
               (duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,
                        CONCAT13(in_stack_fffffffffffffe7b,
                                 CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78))));
    sVar3 = std::chrono::
            operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffe80,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe7c,
                                   CONCAT13(in_stack_fffffffffffffe7b,
                                            CONCAT12(in_stack_fffffffffffffe7a,
                                                     in_stack_fffffffffffffe78))));
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)
               CONCAT44(in_stack_fffffffffffffe7c,
                        CONCAT13(in_stack_fffffffffffffe7b,
                                 CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78))),
               (__unspec *)0x7e3925);
    bVar2 = std::operator<(sVar3._M_value);
    if (bVar2) {
      bVar2 = true;
    }
    else {
      *(undefined8 *)(in_RDI + 0x28) = uVar5;
      bVar2 = false;
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,
                      CONCAT13(in_stack_fffffffffffffe7b,
                               CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78))));
  if (!bVar2) {
    bVar2 = IsInitialBlockDownload(in_stack_ffffffffffffff20);
    pNVar6 = GetNotifications((ChainstateManager *)
                              CONCAT44(in_stack_fffffffffffffe7c,
                                       CONCAT13(in_stack_fffffffffffffe7b,
                                                CONCAT12(in_stack_fffffffffffffe7a,
                                                         in_stack_fffffffffffffe78))));
    std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe90);
    SVar4 = GetSynchronizationState((bool)in_stack_fffffffffffffe7b,(bool)in_stack_fffffffffffffe7a)
    ;
    (*pNVar6->_vptr_Notifications[3])(pNVar6,(ulong)SVar4,in_RDX,in_RCX,1);
    if (bVar2) {
      NodeClock::now();
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
                ((duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,
                          CONCAT13(in_stack_fffffffffffffe7b,
                                   CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78))),
                 (long *)0x7e3a2d);
      std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::
      time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,
                          CONCAT13(in_stack_fffffffffffffe7b,
                                   CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78))),
                 (duration *)0x7e3a42);
      std::chrono::operator-
                ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffe80,
                 (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,
                          CONCAT13(in_stack_fffffffffffffe7b,
                                   CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78))));
      GetConsensus((ChainstateManager *)
                   CONCAT44(in_stack_fffffffffffffe7c,
                            CONCAT13(in_stack_fffffffffffffe7b,
                                     CONCAT12(in_stack_fffffffffffffe7a,in_stack_fffffffffffffe78)))
                  );
      Consensus::Params::PowTargetSpacing(in_stack_fffffffffffffe80);
      std::chrono::operator/
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe90);
      std::max<long>((long *)in_stack_fffffffffffffe80,
                     (long *)CONCAT44(in_stack_fffffffffffffe7c,
                                      CONCAT13(in_stack_fffffffffffffe7b,
                                               CONCAT12(in_stack_fffffffffffffe7a,
                                                        in_stack_fffffffffffffe78))));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (char *)in_stack_fffffffffffffe90);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (char *)in_stack_fffffffffffffe90);
      source_file._M_str = in_stack_ffffffffffffff38;
      source_file._M_len = sVar7;
      LogPrintFormatInternal<long,double>
                (in_stack_ffffffffffffff40,source_file,source_line,(LogFlags)flag,in_stack_00000020,
                 in_RSI,in_stack_00000030,in_stack_00000038);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChainstateManager::ReportHeadersPresync(const arith_uint256& work, int64_t height, int64_t timestamp)
{
    AssertLockNotHeld(cs_main);
    {
        LOCK(cs_main);
        // Don't report headers presync progress if we already have a post-minchainwork header chain.
        // This means we lose reporting for potentially legitimate, but unlikely, deep reorgs, but
        // prevent attackers that spam low-work headers from filling our logs.
        if (m_best_header->nChainWork >= UintToArith256(GetConsensus().nMinimumChainWork)) return;
        // Rate limit headers presync updates to 4 per second, as these are not subject to DoS
        // protection.
        auto now = std::chrono::steady_clock::now();
        if (now < m_last_presync_update + std::chrono::milliseconds{250}) return;
        m_last_presync_update = now;
    }
    bool initial_download = IsInitialBlockDownload();
    GetNotifications().headerTip(GetSynchronizationState(initial_download, m_blockman.m_blockfiles_indexed), height, timestamp, /*presync=*/true);
    if (initial_download) {
        int64_t blocks_left{(NodeClock::now() - NodeSeconds{std::chrono::seconds{timestamp}}) / GetConsensus().PowTargetSpacing()};
        blocks_left = std::max<int64_t>(0, blocks_left);
        const double progress{100.0 * height / (height + blocks_left)};
        LogInfo("Pre-synchronizing blockheaders, height: %d (~%.2f%%)\n", height, progress);
    }
}